

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::createCooperativeMatrixLengthNV(Builder *this,Id type)

{
  Id IVar1;
  Id IVar2;
  Id *pIVar3;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  uint __tmp;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  IVar1 = makeIntegerType(this,0x20,false);
  if (this->generatingOpCodeForSpecConst == true) {
    pIVar3 = (Id *)operator_new(4);
    local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar3 + 1;
    *pIVar3 = type;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = pIVar3;
    local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    IVar1 = createSpecConstantOp(this,OpCooperativeMatrixLengthNV,IVar1,&local_40,&local_58);
    operator_delete(pIVar3,4);
  }
  else {
    this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         operator_new(0x60);
    IVar2 = this->uniqueId + 1;
    this->uniqueId = IVar2;
    *(undefined ***)
     this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
     super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_00927e68;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar2;
    *(Id *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar1;
    *(Op *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
         OpCooperativeMatrixLengthNV;
    (((_Bit_iterator *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
    super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
    (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    (((vector<bool,_std::allocator<bool>_> *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
    super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(uint *)((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
    *(_Bit_pointer *)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) =
         (_Bit_pointer)0x0;
    *(Block **)
     ((long)this_00.
            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
            super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
    Instruction::addIdOperand
              ((Instruction *)
               this_00.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,type);
    local_60._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
         this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                        &local_60);
    if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
        local_60._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
      (**(code **)(*(long *)local_60._M_t.
                            super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                            .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
    }
    IVar1 = *(Id *)((long)this_00.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
  }
  return IVar1;
}

Assistant:

Id Builder::createCooperativeMatrixLengthNV(Id type)
{
    spv::Id intType = makeUintType(32);

    // Generate code for spec constants if in spec constant operation
    // generation mode.
    if (generatingOpCodeForSpecConst) {
        return createSpecConstantOp(OpCooperativeMatrixLengthNV, intType, std::vector<Id>(1, type), std::vector<Id>());
    }

    Instruction* length = new Instruction(getUniqueId(), intType, OpCooperativeMatrixLengthNV);
    length->addIdOperand(type);
    addInstruction(std::unique_ptr<Instruction>(length));

    return length->getResultId();
}